

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.h
# Opt level: O2

void __thiscall json::string::~string(string *this)

{
  (this->super_value)._vptr_value = (_func_int **)&PTR__string_00187ba8;
  std::__cxx11::string::~string((string *)&this->_data);
  return;
}

Assistant:

~string () {}